

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Identifier __thiscall
soul::StructuralParser::parseIdentifierWithMaxLength(StructuralParser *this,size_t maxLength)

{
  char *__s1;
  int iVar1;
  Identifier IVar2;
  
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 != "$identifier") {
    if (__s1 == (char *)0x0) goto LAB_001d2890;
    iVar1 = strcmp(__s1,"$identifier");
    if (iVar1 != 0) goto LAB_001d2890;
  }
  checkLength(this,&(this->super_SOULTokeniser).currentStringValue,maxLength);
LAB_001d2890:
  IVar2 = parseIdentifier(this);
  return (Identifier)IVar2.name;
}

Assistant:

Identifier parseIdentifierWithMaxLength (size_t maxLength)
    {
        if (matches (Token::identifier))
            checkLength (currentStringValue, maxLength);

        return parseIdentifier();
    }